

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canonical_encoders.cc
# Opt level: O3

vector<int,_std::allocator<int>_> * __thiscall
hanabi_learning_env::CanonicalObservationEncoder::Shape
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,
          CanonicalObservationEncoder *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  HanabiGame *pHVar5;
  int iVar6;
  initializer_list<int> __l;
  allocator_type local_d;
  int local_c;
  
  pHVar5 = this->parent_game_;
  iVar1 = pHVar5->num_players_;
  iVar2 = pHVar5->hand_size_;
  iVar3 = pHVar5->num_colors_;
  iVar4 = pHVar5->num_ranks_;
  iVar6 = ((iVar4 + 1) * iVar3 + iVar4) * iVar2 * iVar1;
  if (pHVar5->observation_type_ == kMinimal) {
    iVar6 = 0;
  }
  local_c = (iVar2 * iVar4 * (iVar1 + -1) + (pHVar5->cards_per_color_ + iVar4) * 2) * iVar3 +
            ((iVar1 + iVar3) - iVar2 * iVar1) + iVar4 + (iVar2 + iVar1) * 2 +
            pHVar5->max_information_tokens_ + pHVar5->max_life_tokens_ + iVar6 + 6;
  __l._M_len = 1;
  __l._M_array = &local_c;
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__,__l,&local_d);
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> CanonicalObservationEncoder::Shape() const {
  return {HandsSectionLength(*parent_game_) +
          BoardSectionLength(*parent_game_) +
          DiscardSectionLength(*parent_game_) +
          LastActionSectionLength(*parent_game_) +
          (parent_game_->ObservationType() == HanabiGame::kMinimal
               ? 0
               : CardKnowledgeSectionLength(*parent_game_))};
}